

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Version * __thiscall leveldb::Version::DebugString_abi_cxx11_(Version *this)

{
  ulong uVar1;
  size_type sVar2;
  const_reference ppFVar3;
  long in_RSI;
  InternalKey local_80;
  InternalKey local_60;
  ulong local_40;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int local_20;
  undefined1 local_19;
  int level;
  Version *this_local;
  string *r;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  for (local_20 = 0; local_20 < 7; local_20 = local_20 + 1) {
    std::__cxx11::string::append((char *)this);
    AppendNumberTo((string *)this,(long)local_20);
    std::__cxx11::string::append((char *)this);
    i = in_RSI + 0x20 + (long)local_20 * 0x18;
    for (local_40 = 0; uVar1 = local_40,
        sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)i), uVar1 < sVar2; local_40 = local_40 + 1) {
      std::__cxx11::string::push_back((char)this);
      ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)i,local_40);
      AppendNumberTo((string *)this,(*ppFVar3)->number);
      std::__cxx11::string::push_back((char)this);
      ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)i,local_40);
      AppendNumberTo((string *)this,(*ppFVar3)->file_size);
      std::__cxx11::string::append((char *)this);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)i,
                 local_40);
      InternalKey::DebugString_abi_cxx11_(&local_60);
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::append((char *)this);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)i,
                 local_40);
      InternalKey::DebugString_abi_cxx11_(&local_80);
      std::__cxx11::string::append((string *)this);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::append((char *)this);
    }
  }
  return this;
}

Assistant:

std::string Version::DebugString() const {
  std::string r;
  for (int level = 0; level < config::kNumLevels; level++) {
    // E.g.,
    //   --- level 1 ---
    //   17:123['a' .. 'd']
    //   20:43['e' .. 'g']
    r.append("--- level ");
    AppendNumberTo(&r, level);
    r.append(" ---\n");
    const std::vector<FileMetaData*>& files = files_[level];
    for (size_t i = 0; i < files.size(); i++) {
      r.push_back(' ');
      AppendNumberTo(&r, files[i]->number);
      r.push_back(':');
      AppendNumberTo(&r, files[i]->file_size);
      r.append("[");
      r.append(files[i]->smallest.DebugString());
      r.append(" .. ");
      r.append(files[i]->largest.DebugString());
      r.append("]\n");
    }
  }
  return r;
}